

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O0

error<idx2::err_code> idx2::WriteBuffer(cstr FileName,buffer *Buf)

{
  size_t sVar1;
  error<idx2::err_code> eVar2;
  error<idx2::err_code> eVar3;
  error<idx2::err_code> eVar4;
  err_code local_a0;
  undefined2 uStack_9c;
  anon_class_1_0_00000001 local_91;
  error<idx2::err_code> local_90;
  anon_class_8_1_bfec4fc5 local_80;
  undefined4 local_74;
  error<idx2::err_code> local_70;
  anon_class_8_1_bfec4fc5 local_50;
  undefined1 local_48 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:48:3)>
  __ScopeGuard__48;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__48;
  FILE *Fp;
  buffer *Buf_local;
  cstr FileName_local;
  err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  Buf_local = (buffer *)FileName;
  __CleanUpFunc__48.Fp = (FILE **)fopen(FileName,"wb");
  __ScopeGuard__48._8_8_ = &__CleanUpFunc__48;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:48:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:48:3)>
                 *)local_48,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__48.Dismissed);
  if (__CleanUpFunc__48.Fp == (FILE **)0x0) {
    local_50.FileName = (cstr *)&Buf_local;
    eVar2 = WriteBuffer::anon_class_8_1_bfec4fc5::operator()(&local_50);
    eVar3.Code = local_90.Code;
    eVar3.StackIdx = local_90.StackIdx;
    eVar3.StrGened = local_90.StrGened;
    eVar3._14_2_ = local_90._14_2_;
    eVar3.Msg = local_90.Msg;
    FileName_local = eVar2.Msg;
    local_70.Code = eVar2.Code;
    local_10 = local_70.Code;
    local_70._12_2_ = eVar2._12_2_;
    uStack_c._0_1_ = local_70.StackIdx;
    uStack_c._1_1_ = local_70.StrGened;
  }
  else {
    sVar1 = fwrite(Buf->Data,Buf->Bytes,1,(FILE *)__CleanUpFunc__48.Fp);
    if (sVar1 == 1) {
      eVar4 = WriteBuffer::anon_class_1_0_00000001::operator()(&local_91);
      eVar3.Code = local_90.Code;
      eVar3.StackIdx = local_90.StackIdx;
      eVar3.StrGened = local_90.StrGened;
      eVar3._14_2_ = local_90._14_2_;
      eVar3.Msg = local_90.Msg;
      eVar2.Code = local_70.Code;
      eVar2.StackIdx = local_70.StackIdx;
      eVar2.StrGened = local_70.StrGened;
      eVar2._14_2_ = local_70._14_2_;
      eVar2.Msg = local_70.Msg;
      FileName_local = eVar4.Msg;
      local_a0 = eVar4.Code;
      local_10 = local_a0;
      uStack_9c = eVar4._12_2_;
      uStack_c = uStack_9c;
    }
    else {
      local_80.FileName = (cstr *)&Buf_local;
      eVar3 = WriteBuffer::anon_class_8_1_bfec4fc5::operator()(&local_80);
      eVar2.Code = local_70.Code;
      eVar2.StackIdx = local_70.StackIdx;
      eVar2.StrGened = local_70.StrGened;
      eVar2._14_2_ = local_70._14_2_;
      eVar2.Msg = local_70.Msg;
      FileName_local = eVar3.Msg;
      local_90.Code = eVar3.Code;
      local_10 = local_90.Code;
      local_90._12_2_ = eVar3._12_2_;
      uStack_c._0_1_ = local_90.StackIdx;
      uStack_c._1_1_ = local_90.StrGened;
    }
  }
  local_74 = 1;
  local_90 = eVar3;
  local_70 = eVar2;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:48:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:48:3)>
                  *)local_48);
  eVar4.Code = local_10;
  eVar4.Msg = FileName_local;
  eVar4.StackIdx = (undefined1)uStack_c;
  eVar4.StrGened = (bool)uStack_c._1_1_;
  eVar4._14_2_ = uStack_a;
  return eVar4;
}

Assistant:

error<>
WriteBuffer(cstr FileName, const buffer& Buf)
{
  idx2_Assert(Buf.Data && Buf.Bytes);

  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileCreateFailed, "%s", FileName);

  /* Read file contents */
  if (fwrite(Buf.Data, size_t(Buf.Bytes), 1, Fp) != 1)
    return idx2_Error(err_code::FileWriteFailed, "%s", FileName);
  return idx2_Error(err_code::NoError);
}